

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.hpp
# Opt level: O3

void __thiscall peach::fsm::NameFinder::NameFinder(NameFinder *this)

{
  element_type *category;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<peach::fsm::Node> firstNode;
  undefined1 local_48 [24];
  pointer local_30;
  pointer local_20;
  
  FiniteStateMachine::FiniteStateMachine(&this->super_FiniteStateMachine);
  category = (this->super_FiniteStateMachine).root_.
             super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->super_FiniteStateMachine).root_.
            super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  Node::
  addTransitionToNewNode<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>>
            ((Node *)local_48,(tokenCategory_t)category);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_48._16_8_ = local_48._0_8_;
  local_30 = (pointer)local_48._8_8_;
  if ((pointer)local_48._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((shared_ptr<peach::fsm::Node> *)(local_48._8_8_ + 8))->
               super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((shared_ptr<peach::fsm::Node> *)(local_48._8_8_ + 8))->
                    super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((shared_ptr<peach::fsm::Node> *)(local_48._8_8_ + 8))->
               super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((shared_ptr<peach::fsm::Node> *)(local_48._8_8_ + 8))->
                    super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
    }
  }
  Node::
  addTransition<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>,peach::transition::RangeCharTransitionTemplate<(char)48,(char)57>>>
            ((Node *)local_48._0_8_,(shared_ptr<peach::fsm::Node> *)(local_48 + 0x10));
  if (local_30 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  Node::
  addTransitionToNewNode<peach::transition::TransitionNegation<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>,peach::transition::RangeCharTransitionTemplate<(char)48,(char)57>>>>
            ((Node *)&stack0xffffffffffffffd8,local_48._0_8_);
  if (local_20 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  if ((pointer)local_48._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  return;
}

Assistant:

NameFinder()
    {
        auto firstNode = getRoot()->addTransitionToNewNode<transition::LatinUnderscoreTransition>(token::tokenCategory::UNDEFINED);
        firstNode->addTransition<transition::LatinUnderscoreDigitTransition>(firstNode);
        firstNode->addTransitionToNewNode<transition::TransitionNegation<transition::LatinUnderscoreDigitTransition>>(token::tokenCategory::NAME);
    }